

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<const_char_*> * __thiscall
kj::_::NullableValue<const_char_*>::operator=
          (NullableValue<const_char_*> *this,NullableValue<const_char_*> *other)

{
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
    }
    if (other->isSet == true) {
      this->field_1 = other->field_1;
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }